

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

void __thiscall capnp::JsonCodec::decode(JsonCodec *this,ArrayPtr<const_char> input,Builder output)

{
  Builder output_00;
  Reader input_00;
  Builder json;
  MallocMessageBuilder message;
  StructBuilder local_198;
  Builder local_170;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  PointerBuilder local_128;
  MallocMessageBuilder local_110;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_110,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_170,&local_110.super_MessageBuilder);
  local_128.pointer = local_170.builder.pointer;
  local_128.segment = local_170.builder.segment;
  local_128.capTable = local_170.builder.capTable;
  capnp::_::PointerBuilder::getStruct(&local_198,&local_128,(StructSize)0x10002,(word *)0x0);
  output_00._builder.capTable = local_198.capTable;
  output_00._builder.segment = local_198.segment;
  output_00._builder.data = local_198.data;
  output_00._builder.pointers = local_198.pointers;
  output_00._builder.dataSize = local_198.dataSize;
  output_00._builder.pointerCount = local_198.pointerCount;
  output_00._builder._38_2_ = local_198._38_2_;
  decodeRaw(this,input,output_00);
  capnp::_::StructBuilder::asReader(&local_198);
  input_00._reader.capTable = (CapTableReader *)uStack_150;
  input_00._reader.segment = (SegmentReader *)local_158;
  input_00._reader.data = (void *)local_148;
  input_00._reader.pointers = (WirePointer *)uStack_140;
  input_00._reader.dataSize = (undefined4)local_138;
  input_00._reader.pointerCount = local_138._4_2_;
  input_00._reader._38_2_ = local_138._6_2_;
  input_00._reader._40_8_ = uStack_130;
  decode(this,input_00,output);
  MallocMessageBuilder::~MallocMessageBuilder(&local_110);
  return;
}

Assistant:

void JsonCodec::decode(kj::ArrayPtr<const char> input, DynamicStruct::Builder output) const {
  MallocMessageBuilder message;
  auto json = message.getRoot<JsonValue>();
  decodeRaw(input, json);
  decode(json, output);
}